

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O0

void Llb_NonlinExperiment(Aig_Man_t *pAig,int Num)

{
  abctime aVar1;
  Aig_Man_t *p_00;
  abctime aVar2;
  abctime clk;
  Aig_Man_t *p;
  Gia_ParLlb_t *pPars;
  Gia_ParLlb_t Pars;
  Llb_Mnn_t *pMnn;
  int Num_local;
  Aig_Man_t *pAig_local;
  
  aVar1 = Abc_Clock();
  Llb_ManSetDefaultParams((Gia_ParLlb_t *)&pPars);
  Pars.fSchedule = 1;
  p_00 = Aig_ManDupFlopsOnly(pAig);
  Aig_ManPrintStats(pAig);
  Aig_ManPrintStats(p_00);
  Pars._104_8_ = Llb_MnnStart(pAig,p_00,(Gia_ParLlb_t *)&pPars);
  Llb_NonlinReachability((Llb_Mnn_t *)Pars._104_8_);
  aVar2 = Abc_Clock();
  *(abctime *)(Pars._104_8_ + 0xb8) = aVar2 - aVar1;
  Llb_MnnStop((Llb_Mnn_t *)Pars._104_8_);
  Aig_ManStop(p_00);
  return;
}

Assistant:

void Llb_NonlinExperiment( Aig_Man_t * pAig, int Num )
{
    Llb_Mnn_t * pMnn;
    Gia_ParLlb_t Pars, * pPars = &Pars;
    Aig_Man_t * p;
    abctime clk = Abc_Clock();

    Llb_ManSetDefaultParams( pPars );
    pPars->fVerbose = 1;

    p = Aig_ManDupFlopsOnly( pAig );
//Aig_ManShow( p, 0, NULL );
    Aig_ManPrintStats( pAig );
    Aig_ManPrintStats( p );

    pMnn = Llb_MnnStart( pAig, p, pPars );
    Llb_NonlinReachability( pMnn );
    pMnn->timeTotal = Abc_Clock() - clk;
    Llb_MnnStop( pMnn );

    Aig_ManStop( p );
}